

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  cmTarget *this_00;
  char *pcVar7;
  char *pcVar8;
  cmSourceFile *this_01;
  string tLocation;
  string depLocation;
  string name;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string *local_40;
  string *local_38;
  
  cmsys::SystemTools::GetFilenameName(&local_60,inName);
  iVar6 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar6 == 0) {
LAB_0034cb7c:
    bVar5 = false;
  }
  else {
    cmsys::SystemTools::GetFilenameLastExtension(&local_c0,&local_60);
    iVar6 = std::__cxx11::string::compare((char *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (iVar6 == 0) {
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_c0,&local_60);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
    }
    this_00 = cmMakefile::FindTargetToUse(this->Makefile,&local_60,false);
    if (this_00 != (cmTarget *)0x0) {
      bVar5 = cmsys::SystemTools::FileIsFullPath((inName->_M_dataplus)._M_p);
      if (bVar5) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        local_c0._M_string_length = 0;
        local_c0.field_2._M_local_buf[0] = '\0';
        local_38 = dep;
        if (this_00->TargetTypeValue < OBJECT_LIBRARY) {
          local_40 = config;
          pcVar7 = cmTarget::GetLocation(this_00,config);
          sVar3 = local_c0._M_string_length;
          strlen(pcVar7);
          std::__cxx11::string::_M_replace((ulong)&local_c0,0,(char *)sVar3,(ulong)pcVar7);
          cmsys::SystemTools::GetFilenamePath(&local_a0,&local_c0);
          std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          cmsys::SystemTools::CollapseFullPath(&local_a0,&local_c0);
          std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
          config = local_40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            config = local_40;
          }
        }
        paVar1 = &local_80.field_2;
        pcVar2 = (inName->_M_dataplus)._M_p;
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar2,pcVar2 + inName->_M_string_length);
        cmsys::SystemTools::GetFilenamePath(&local_a0,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        cmsys::SystemTools::CollapseFullPath(&local_80,&local_a0);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        dep = local_38;
        _Var4._M_p = local_a0._M_dataplus._M_p;
        if ((local_a0._M_string_length != local_c0._M_string_length) ||
           (((char *)local_a0._M_string_length != (char *)0x0 &&
            (iVar6 = bcmp(local_a0._M_dataplus._M_p,local_c0._M_dataplus._M_p,
                          local_a0._M_string_length), iVar6 != 0)))) {
          std::__cxx11::string::_M_assign((string *)dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,
                            CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                     local_c0.field_2._M_local_buf[0]) + 1);
          }
          bVar5 = true;
          goto LAB_0034cc1a;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var4._M_p != &local_a0.field_2) {
          operator_delete(_Var4._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,
                          CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                   local_c0.field_2._M_local_buf[0]) + 1);
        }
      }
      if (this_00->TargetTypeValue < (UNKNOWN_LIBRARY|STATIC_LIBRARY)) {
        if ((0x10fU >> (this_00->TargetTypeValue & 0x1f) & 1) != 0) {
          pcVar8 = cmTarget::GetLocation(this_00,config);
          pcVar7 = (char *)dep->_M_string_length;
          strlen(pcVar8);
          bVar5 = true;
          std::__cxx11::string::_M_replace((ulong)dep,0,pcVar7,(ulong)pcVar8);
          goto LAB_0034cc1a;
        }
        goto LAB_0034cb7c;
      }
    }
    bVar5 = cmsys::SystemTools::FileIsFullPath((inName->_M_dataplus)._M_p);
    if (bVar5) {
      bVar5 = true;
      std::__cxx11::string::_M_assign((string *)dep);
    }
    else {
      this_01 = cmMakefile::GetSource(this->Makefile,inName);
      if (this_01 == (cmSourceFile *)0x0) {
        pcVar8 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
        pcVar7 = (char *)dep->_M_string_length;
        strlen(pcVar8);
        std::__cxx11::string::_M_replace((ulong)dep,0,pcVar7,(ulong)pcVar8);
        std::__cxx11::string::append((char *)dep);
        bVar5 = true;
        std::__cxx11::string::_M_append((char *)dep,(ulong)(inName->_M_dataplus)._M_p);
      }
      else {
        cmSourceFile::GetFullPath(this_01,(string *)0x0);
        bVar5 = true;
        std::__cxx11::string::_M_assign((string *)dep);
      }
    }
  }
LAB_0034cc1a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if(name == "")
    {
    return false;
    }

  if(cmSystemTools::GetFilenameLastExtension(name) == ".exe")
    {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
    }

  // Look for a CMake target with the given name.
  if(cmTarget* target = this->Makefile->FindTargetToUse(name))
    {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if(cmSystemTools::FileIsFullPath(inName.c_str()))
      {
      std::string tLocation;
      if(target->GetType() >= cmTarget::EXECUTABLE &&
         target->GetType() <= cmTarget::MODULE_LIBRARY)
        {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
        }
      std::string depLocation = cmSystemTools::GetFilenamePath(
        std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if(depLocation != tLocation)
        {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
        }
      }
    switch (target->GetType())
      {
      case cmTarget::EXECUTABLE:
      case cmTarget::STATIC_LIBRARY:
      case cmTarget::SHARED_LIBRARY:
      case cmTarget::MODULE_LIBRARY:
      case cmTarget::UNKNOWN_LIBRARY:
        dep = target->GetLocation(config);
        return true;
      case cmTarget::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmTarget::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmTarget::UTILITY:
      case cmTarget::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
      }
    }

  // The name was not that of a CMake target.  It must name a file.
  if(cmSystemTools::FileIsFullPath(inName.c_str()))
    {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
    }

  // Check for a source file in this directory that matches the
  // dependency.
  if(cmSourceFile* sf = this->Makefile->GetSource(inName))
    {
    dep = sf->GetFullPath();
    return true;
    }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = this->StateSnapshot.GetCurrentSourceDirectory();
  dep += "/";
  dep += inName;
  return true;
}